

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

int slang::ast::AssertionExpr::bind(int __fd,sockaddr *__addr,socklen_t __len)

{
  SourceRange sourceRange;
  bool bVar1;
  uint uVar2;
  int iVar3;
  SequenceExprSyntax *pSVar4;
  ParenthesizedPropertyExprSyntax *pPVar5;
  PropertyExprSyntax *pPVar6;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  SyntaxNode *this;
  SourceRange SVar7;
  NondegeneracyRequirement unaff_retaddr;
  ASTContext *in_stack_00000008;
  AssertionExpr *in_stack_00000010;
  PropertyExprSyntax *item;
  iterator __end5;
  iterator __begin5;
  SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *__range5;
  ParenthesizedPropertyExprSyntax *ppe;
  AssertionExpr *seq;
  AssertionExpr *result;
  ASTContext ctx;
  ASTContext *in_stack_00000148;
  CasePropertyExprSyntax *in_stack_00000150;
  AssertionExpr *expr;
  Compilation *compilation;
  ASTContext *context;
  undefined4 in_stack_ffffffffffffff30;
  SyntaxKind SVar8;
  ASTContext *in_stack_ffffffffffffff38;
  ConditionalPropertyExprSyntax *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 uVar9;
  AcceptOnPropertyExprSyntax *in_stack_ffffffffffffff50;
  DiagCode code;
  SyntaxNode *local_98;
  bitmask<slang::ast::ASTFlags> local_80;
  ASTContext *in_stack_ffffffffffffff88;
  UnaryPropertyExprSyntax *in_stack_ffffffffffffff90;
  AssertionExpr *local_68;
  undefined1 local_58 [16];
  Symbol *local_48;
  TempVarSymbol *context_00;
  RandomizeDetails *context_01;
  AssertionInstanceDetails *syntax;
  SyntaxNode *in_stack_fffffffffffffff8;
  
  this = (SyntaxNode *)CONCAT44(in_register_0000003c,__fd);
  local_58._0_2_ = __addr->sa_family;
  local_58[2] = __addr->sa_data[0];
  local_58[3] = __addr->sa_data[1];
  local_58[4] = __addr->sa_data[2];
  local_58[5] = __addr->sa_data[3];
  local_58[6] = __addr->sa_data[4];
  local_58[7] = __addr->sa_data[5];
  local_58._8_8_ = *(undefined8 *)(__addr->sa_data + 6);
  local_48 = *(Symbol **)(__addr + 1);
  context_00 = *(TempVarSymbol **)(__addr[1].sa_data + 6);
  context_01 = *(RandomizeDetails **)(__addr + 2);
  syntax = *(AssertionInstanceDetails **)(__addr[2].sa_data + 6);
  compilation = (Compilation *)&stack0xffffffffffffffb8;
  context = (ASTContext *)&stack0xffffffffffffffa0;
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)context,AssignmentDisallowed);
  bitmask<slang::ast::ASTFlags>::operator|=
            ((bitmask<slang::ast::ASTFlags> *)compilation,(bitmask<slang::ast::ASTFlags> *)context);
  SVar8 = this->kind;
  if (SVar8 == AcceptOnPropertyExpr) {
    slang::syntax::SyntaxNode::as<slang::syntax::AcceptOnPropertyExprSyntax>(this);
    local_68 = AbortAssertionExpr::fromSyntax
                         (in_stack_ffffffffffffff50,
                          (ASTContext *)
                          CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  }
  else {
    if (SVar8 == AndPropertyExpr) goto LAB_009473d1;
    if (SVar8 == CasePropertyExpr) {
      slang::syntax::SyntaxNode::as<slang::syntax::CasePropertyExprSyntax>(this);
      local_68 = CaseAssertionExpr::fromSyntax(in_stack_00000150,in_stack_00000148);
    }
    else if (SVar8 == ClockingPropertyExpr) {
      slang::syntax::SyntaxNode::as<slang::syntax::ClockingPropertyExprSyntax>(this);
      local_68 = ClockingAssertionExpr::fromSyntax
                           ((ClockingPropertyExprSyntax *)context_01,(ASTContext *)context_00);
    }
    else if (SVar8 == ConditionalPropertyExpr) {
      slang::syntax::SyntaxNode::as<slang::syntax::ConditionalPropertyExprSyntax>(this);
      local_68 = ConditionalAssertionExpr::fromSyntax
                           (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    else if ((((SVar8 == FollowedByPropertyExpr) || (SVar8 == IffPropertyExpr)) ||
             (SVar8 == ImplicationPropertyExpr)) ||
            ((SVar8 == ImpliesPropertyExpr || (SVar8 == OrPropertyExpr)))) {
LAB_009473d1:
      slang::syntax::SyntaxNode::as<slang::syntax::BinaryPropertyExprSyntax>(this);
      local_68 = BinaryAssertionExpr::fromSyntax
                           ((BinaryPropertyExprSyntax *)__begin5.list,(ASTContext *)__end5.index);
    }
    else if (SVar8 == ParenthesizedPropertyExpr) {
      pPVar5 = slang::syntax::SyntaxNode::as<slang::syntax::ParenthesizedPropertyExprSyntax>(this);
      code = SUB84((ulong)in_stack_ffffffffffffff50 >> 0x20,0);
      if (pPVar5->matchList != (SequenceMatchListSyntax *)0x0) {
        expr = (AssertionExpr *)&stack0xffffffffffffffb8;
        bitmask<slang::ast::ASTFlags>::bitmask(&local_80,AssertionInstanceArgCheck);
        bVar1 = bitmask<slang::ast::ASTFlags>::has
                          ((bitmask<slang::ast::ASTFlags> *)
                           CONCAT44(SVar8,in_stack_ffffffffffffff30),
                           (bitmask<slang::ast::ASTFlags> *)context);
        if (!bVar1) {
          uVar9 = 0x200008;
          SVar7 = slang::syntax::SyntaxNode::sourceRange(local_98);
          sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff48;
          sourceRange.startLoc = SVar7.endLoc;
          sourceRange.endLoc._4_4_ = uVar9;
          ASTContext::addDiag((ASTContext *)SVar7.startLoc,code,sourceRange);
          ASTContext::getCompilation((ASTContext *)0x947521);
          local_68 = badExpr(compilation,expr);
          goto LAB_009476a9;
        }
        slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::begin
                  ((SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)0x94746f);
        slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::end
                  ((SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *)compilation);
        while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<slang::syntax::PropertyExprSyntax_*>_>
                                 ((self_type *)compilation,
                                  (iterator_base<slang::syntax::PropertyExprSyntax_*> *)expr),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          pPVar6 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<slang::syntax::PropertyExprSyntax_*>,_false>
                   ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<slang::syntax::PropertyExprSyntax_*>,_false>
                                *)0x9474ae);
          bind((int)pPVar6,(sockaddr *)local_58,0);
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<slang::syntax::PropertyExprSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<slang::syntax::PropertyExprSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::iterator_base<slang::syntax::PropertyExprSyntax_*>,_false>
                      *)compilation);
        }
      }
      pPVar6 = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                         ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x94754a);
      iVar3 = bind((int)pPVar6,__addr,0);
      local_68 = (AssertionExpr *)CONCAT44(extraout_var,iVar3);
    }
    else {
      if (SVar8 - SUntilPropertyExpr < 2) goto LAB_009473d1;
      if (SVar8 == SimplePropertyExpr) {
        slang::syntax::SyntaxNode::as<slang::syntax::SimplePropertyExprSyntax>(this);
        pSVar4 = not_null<slang::syntax::SequenceExprSyntax_*>::operator*
                           ((not_null<slang::syntax::SequenceExprSyntax_*> *)0x94737d);
        uVar2 = bind((int)pSVar4,(sockaddr *)local_58,(uint)((byte)__len & 1));
        local_68 = (AssertionExpr *)(ulong)uVar2;
        enforceNondegeneracy
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
        goto LAB_009476a9;
      }
      if (SVar8 == StrongWeakPropertyExpr) {
        slang::syntax::SyntaxNode::as<slang::syntax::StrongWeakPropertyExprSyntax>(this);
        local_68 = StrongWeakAssertionExpr::fromSyntax
                             ((StrongWeakPropertyExprSyntax *)
                              CONCAT44(SVar8,in_stack_ffffffffffffff30),context);
      }
      else if (SVar8 == UnaryPropertyExpr) {
        slang::syntax::SyntaxNode::as<slang::syntax::UnaryPropertyExprSyntax>(this);
        local_68 = UnaryAssertionExpr::fromSyntax
                             (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        if (SVar8 != UnarySelectPropertyExpr) goto LAB_009473d1;
        slang::syntax::SyntaxNode::as<slang::syntax::UnarySelectPropertyExprSyntax>(this);
        local_68 = UnaryAssertionExpr::fromSyntax
                             ((UnarySelectPropertyExprSyntax *)syntax,(ASTContext *)context_01);
      }
    }
  }
  local_68->syntax = this;
LAB_009476a9:
  return (int)local_68;
}

Assistant:

const AssertionExpr& AssertionExpr::bind(const PropertyExprSyntax& syntax,
                                         const ASTContext& context, bool allowDisable,
                                         NondegeneracyRequirement nondegRequirement) {
    ASTContext ctx(context);
    ctx.flags |= ASTFlags::AssignmentDisallowed;

    AssertionExpr* result;
    switch (syntax.kind) {
        case SyntaxKind::SimplePropertyExpr: {
            auto& seq = bind(*syntax.as<SimplePropertyExprSyntax>().expr, ctx, allowDisable);
            enforceNondegeneracy(seq, context, nondegRequirement, syntax);
            return seq;
        }
        case SyntaxKind::AndPropertyExpr:
        case SyntaxKind::OrPropertyExpr:
        case SyntaxKind::IffPropertyExpr:
        case SyntaxKind::UntilPropertyExpr:
        case SyntaxKind::SUntilPropertyExpr:
        case SyntaxKind::UntilWithPropertyExpr:
        case SyntaxKind::SUntilWithPropertyExpr:
        case SyntaxKind::ImpliesPropertyExpr:
        case SyntaxKind::ImplicationPropertyExpr:
        case SyntaxKind::FollowedByPropertyExpr:
            result = &BinaryAssertionExpr::fromSyntax(syntax.as<BinaryPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::ParenthesizedPropertyExpr: {
            auto& ppe = syntax.as<ParenthesizedPropertyExprSyntax>();
            if (ppe.matchList) {
                // Similarly to the match list in a parenthesized sequence expression, during
                // argument checking this can be part of an event expression instead.
                if (ctx.flags.has(ASTFlags::AssertionInstanceArgCheck)) {
                    for (auto item : ppe.matchList->items)
                        AssertionExpr::bind(*item, ctx);
                }
                else {
                    ctx.addDiag(diag::InvalidCommaInPropExpr, ppe.matchList->sourceRange());
                    return badExpr(ctx.getCompilation(), nullptr);
                }
            }

            result = const_cast<AssertionExpr*>(&bind(*ppe.expr, context));
            break;
        }
        case SyntaxKind::ClockingPropertyExpr:
            result = &ClockingAssertionExpr::fromSyntax(syntax.as<ClockingPropertyExprSyntax>(),
                                                        ctx);
            break;
        case SyntaxKind::StrongWeakPropertyExpr:
            result = &StrongWeakAssertionExpr::fromSyntax(syntax.as<StrongWeakPropertyExprSyntax>(),
                                                          ctx);
            break;
        case SyntaxKind::UnaryPropertyExpr:
            result = &UnaryAssertionExpr::fromSyntax(syntax.as<UnaryPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::UnarySelectPropertyExpr:
            result = &UnaryAssertionExpr::fromSyntax(syntax.as<UnarySelectPropertyExprSyntax>(),
                                                     ctx);
            break;
        case SyntaxKind::AcceptOnPropertyExpr:
            result = &AbortAssertionExpr::fromSyntax(syntax.as<AcceptOnPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::ConditionalPropertyExpr:
            result = &ConditionalAssertionExpr::fromSyntax(
                syntax.as<ConditionalPropertyExprSyntax>(), ctx);
            break;
        case SyntaxKind::CasePropertyExpr:
            result = &CaseAssertionExpr::fromSyntax(syntax.as<CasePropertyExprSyntax>(), ctx);
            break;
        default:
            SLANG_UNREACHABLE;
    }

    result->syntax = &syntax;
    return *result;
}